

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O2

apx_error_t
apx_program_decode_header(uint8_t *begin,uint8_t *end,uint8_t **next,apx_programHeader_t *header)

{
  uint32_t *number;
  char cVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint32_t uVar5;
  apx_error_t aVar6;
  byte *pbVar7;
  uint8_t variant;
  uint8_t *puVar8;
  apx_error_t aVar9;
  
  aVar6 = 1;
  if ((end != (uint8_t *)0x0 && begin != (uint8_t *)0x0) &&
     (puVar8 = begin + 1,
     (header != (apx_programHeader_t *)0x0 && next != (uint8_t **)0x0) && puVar8 < end)) {
    header->element_size = 0;
    header->queue_length = 0;
    bVar4 = *begin;
    header->program_type = bVar4 >> 3 & 1;
    bVar2 = *begin;
    header->has_dynamic_data = (_Bool)(bVar2 >> 4 & 1);
    *next = puVar8;
    number = &header->data_size;
    pbVar7 = apx_vm_parse_uint32_by_variant(puVar8,end,bVar4 & 7,number);
    aVar9 = 3;
    aVar6 = aVar9;
    if ((pbVar7 <= end) && (*next < pbVar7)) {
      *next = pbVar7;
      aVar6 = 0;
      if ((((bVar2 & 0x20) != 0) && (aVar6 = aVar9, pbVar7 < end)) &&
         (bVar4 = *pbVar7 >> 3 & 0xf, 0xf6 < (byte)(bVar4 - 0xc) && (*pbVar7 & 7) == 2)) {
        *next = pbVar7 + 1;
        variant = '\x02' - (bVar4 < 9);
        cVar1 = (bVar4 < 9) * '\x03' + -9;
        if (bVar4 < 6) {
          variant = '\0';
          cVar1 = -3;
        }
        uVar5 = apx_vm_variant_to_size(cVar1 + bVar4);
        if ((uVar5 != 0) && (uVar5 <= *number)) {
          puVar8 = apx_vm_parse_uint32_by_variant(*next,end,variant,&header->element_size);
          if ((puVar8 <= end) && (*next < puVar8)) {
            *next = puVar8;
            uVar3 = header->element_size;
            if (uVar3 != 0) {
              if ((*number - uVar5) % uVar3 == 0) {
                header->queue_length = (*number - uVar5) / uVar3;
                aVar6 = 0;
              }
              else {
                aVar6 = 0x41;
              }
            }
          }
        }
      }
    }
  }
  return aVar6;
}

Assistant:

apx_error_t apx_program_decode_header(uint8_t const* begin, uint8_t const* end, uint8_t const** next, apx_programHeader_t* header)
{
   if ((begin != NULL) && (end != NULL) && ((begin + UINT8_SIZE) < end) && (next != NULL) && (header != NULL))
   {
      uint8_t const* result = NULL;
      header->element_size = 0u;
      header->queue_length = 0u;
      uint8_t data_variant = begin[0] & APX_VM_HEADER_DATA_VARIANT_MASK;
      header->program_type = ((begin[0] & APX_VM_HEADER_PROG_TYPE_PACK) == APX_VM_HEADER_PROG_TYPE_PACK) ? APX_PACK_PROGRAM : APX_UNPACK_PROGRAM;
      bool const is_queued_data = ((begin[0] & APX_VM_HEADER_FLAG_QUEUED_DATA) == APX_VM_HEADER_FLAG_QUEUED_DATA);
      header->has_dynamic_data = ((begin[0] & APX_VM_HEADER_FLAG_DYNAMIC_DATA) == APX_VM_HEADER_FLAG_DYNAMIC_DATA);
      *next = begin+1;
      result = apx_vm_parse_uint32_by_variant(*next, end, data_variant, &header->data_size);
      if ((result > *next) && (result <= end))
      {
         *next = result;
      }
      else
      {
         return APX_PARSE_ERROR;
      }

      if (is_queued_data)
      {
         uint8_t opcode = 0u;
         uint8_t variant = 0u;
         bool flag = false;;
         uint8_t element_variant = 0u;
         uint8_t queued_variant = 0u;
         uint32_t queued_elem_size = 0u;
         uint32_t tmp = 0u;
         if (*next >= end)
         {
            return APX_PARSE_ERROR;
         }
         apx_program_decode_instruction(**next, &opcode, &variant, &flag);
         if ((opcode != APX_VM_OPCODE_DATA_SIZE) || (variant < APX_VM_VARIANT_ELEMENT_SIZE_U8_BASE) || (variant > APX_VM_VARIANT_ELEMENT_SIZE_LAST))
         {
            return APX_PARSE_ERROR;
         }
         (*next)++;
         if (variant < APX_VM_VARIANT_ELEMENT_SIZE_U16_BASE) //variant is between 3..5
         {
            element_variant = APX_VM_VARIANT_UINT8;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U8_BASE;
         }
         else if (variant < APX_VM_VARIANT_ELEMENT_SIZE_U32_BASE) //variant is between 6..8
         {
            element_variant = APX_VM_VARIANT_UINT16;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U16_BASE;
         }
         else //variant is between 9..11
         {
            element_variant = APX_VM_VARIANT_UINT32;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U32_BASE;
         }
         queued_elem_size = (uint32_t)apx_vm_variant_to_size(queued_variant);
         if ((queued_elem_size == 0u) || (queued_elem_size > header->data_size))
         {
            return APX_PARSE_ERROR;
         }
         result = apx_vm_parse_uint32_by_variant(*next, end, element_variant, &header->element_size);
         if ((result > *next) && (result <= end))
         {
            *next = result;
         }
         else
         {
            return APX_PARSE_ERROR;
         }
         //Calculate element size by subtracting queued_elem_size from header->data_size then dividing by header->element_size
         if (header->element_size == 0)
         {
            return APX_PARSE_ERROR;
         }
         tmp = header->data_size - queued_elem_size;
         if (tmp % header->element_size != 0)
         {
            return APX_INVALID_HEADER_ERROR;
         }
         header->queue_length = tmp / header->element_size;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;

}